

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

void get_msurf_descriptor(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int s;
  int row;
  int iVar13;
  int sample_x;
  int col;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 extraout_var [60];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float local_fc;
  int local_f8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  ulong local_98;
  float local_78;
  
  auVar19._8_4_ = 0x3effffff;
  auVar19._0_8_ = 0x3effffff3effffff;
  auVar19._12_4_ = 0x3effffff;
  auVar16._8_4_ = 0x80000000;
  auVar16._0_8_ = 0x8000000080000000;
  auVar16._12_4_ = 0x80000000;
  fVar21 = ipoint->scale;
  fVar45 = -0.5;
  local_f8 = -3;
  lVar11 = 0;
  auVar41._0_8_ = (double)fVar21;
  auVar14 = vpternlogd_avx512vl(auVar19,ZEXT416((uint)ipoint->x),auVar16,0xf8);
  auVar15 = vpternlogd_avx512vl(auVar19,ZEXT416((uint)ipoint->y),auVar16,0xf8);
  auVar16 = vpternlogd_avx512vl(auVar19,ZEXT416((uint)fVar21),auVar16,0xf8);
  auVar14 = ZEXT416((uint)(ipoint->x + auVar14._0_4_));
  auVar14 = vroundss_avx(auVar14,auVar14,0xb);
  auVar15 = ZEXT416((uint)(ipoint->y + auVar15._0_4_));
  auVar15 = vroundss_avx(auVar15,auVar15,0xb);
  auVar17._0_4_ = (int)auVar14._0_4_;
  auVar17._4_4_ = (int)auVar14._4_4_;
  auVar17._8_4_ = (int)auVar14._8_4_;
  auVar17._12_4_ = (int)auVar14._12_4_;
  auVar14 = vcvtdq2pd_avx(auVar17);
  auVar18._0_4_ = (int)auVar15._0_4_;
  auVar18._4_4_ = (int)auVar15._4_4_;
  auVar18._8_4_ = (int)auVar15._8_4_;
  auVar18._12_4_ = (int)auVar15._12_4_;
  auVar15 = vcvtdq2pd_avx(auVar18);
  fVar4 = fVar21 * 2.5;
  auVar40 = ZEXT1664(CONCAT88(0x8000000000000000,0x8000000000000000));
  auVar16 = ZEXT416((uint)(fVar21 + auVar16._0_4_));
  auVar16 = vroundss_avx(auVar16,auVar16,0xb);
  s = (int)(auVar16._0_4_ + auVar16._0_4_);
  auVar33 = ZEXT1264(ZEXT812(0));
  auVar39 = ZEXT1664(CONCAT88(0x3fdfffffffffffff,0x3fdfffffffffffff));
  iVar8 = -8;
  do {
    fVar45 = fVar45 + 1.0;
    lVar11 = (long)(int)lVar11;
    iVar12 = 0;
    local_98 = auVar14._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_98;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = (double)(iVar8 + -4) + 4.5;
    auVar41._8_8_ = 0;
    auVar16 = vfmadd213sd_fma(auVar37,auVar41,auVar20);
    auVar17 = vpternlogq_avx512vl(auVar39._0_16_,auVar16,auVar40._0_16_,0xf8);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auVar16._0_8_ + auVar17._0_8_;
    auVar16 = vroundsd_avx(auVar34,auVar34,0xb);
    auVar35._0_4_ = (int)auVar16._0_8_;
    auVar35._4_4_ = (int)auVar16._8_8_;
    auVar35._8_8_ = 0;
    local_fc = -0.5;
    auVar16 = vcvtdq2ps_avx(auVar35);
    iVar9 = -8;
    do {
      auVar23._8_8_ = 0;
      auVar23._0_8_ = (double)(iVar9 + -4) + 4.5;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = auVar41._0_8_;
      auVar17 = vfmadd213sd_fma(auVar23,auVar42,auVar15);
      auVar18 = vpternlogq_avx512vl(auVar39._0_16_,auVar17,auVar40._0_16_,0xf8);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar17._0_8_ + auVar18._0_8_;
      auVar17 = vroundsd_avx(auVar24,auVar24,0xb);
      auVar25._0_4_ = (int)auVar17._0_8_;
      auVar25._4_4_ = (int)auVar17._8_8_;
      auVar25._8_8_ = 0;
      auVar17 = vcvtdq2ps_avx(auVar25);
      local_d8 = 0.0;
      fStack_d4 = 0.0;
      fStack_d0 = 0.0;
      fStack_cc = 0.0;
      iVar10 = iVar8 + -4;
      do {
        iVar13 = -0xc;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_98;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = (double)iVar10 + 0.5;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = auVar41._0_8_;
        auVar18 = vfmadd213sd_fma(auVar26,auVar43,auVar2);
        auVar19 = vpternlogq_avx512vl(auVar39._0_16_,auVar18,auVar40._0_16_,0xf8);
        local_78 = auVar16._0_4_;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = auVar18._0_8_ + auVar19._0_8_;
        auVar18 = vroundsd_avx(auVar27,auVar27,0xb);
        col = (int)auVar18._0_8_;
        auVar28._0_4_ = (int)auVar18._0_8_;
        auVar28._4_4_ = (int)auVar18._8_8_;
        auVar28._8_8_ = 0;
        auVar18 = vcvtdq2ps_avx(auVar28);
        do {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = (double)(iVar12 + iVar13) + 0.5;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = auVar41._0_8_;
          auVar19 = vfmadd213sd_fma(auVar29,auVar44,auVar15);
          auVar20 = vpternlogq_avx512vl(auVar39._0_16_,auVar19,auVar40._0_16_,0xf8);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = auVar19._0_8_ + auVar20._0_8_;
          auVar19 = vroundsd_avx(auVar30,auVar30,0xb);
          row = (int)auVar19._0_8_;
          auVar31._0_4_ = (int)auVar19._0_8_;
          auVar31._4_4_ = (int)auVar19._8_8_;
          auVar31._8_8_ = 0;
          auVar19 = vcvtdq2ps_avx(auVar31);
          fVar21 = auVar17._0_4_ - auVar19._0_4_;
          auVar19 = ZEXT416((uint)(local_78 - auVar18._0_4_));
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),auVar19,auVar19);
          auVar5._8_4_ = 0x80000000;
          auVar5._0_8_ = 0x8000000080000000;
          auVar5._12_4_ = 0x80000000;
          auVar19 = vxorps_avx512vl(auVar19,auVar5);
          fVar21 = expf(auVar19._0_4_ / (fVar4 * (fVar4 + fVar4)));
          fVar21 = fVar21 * (1.0 / (fVar4 * 6.2831855 * fVar4));
          fVar22 = haarX(iimage,row,col,s);
          auVar39._0_4_ = haarY(iimage,row,col,s);
          auVar39._4_60_ = extraout_var;
          auVar19 = vinsertps_avx(auVar39._0_16_,ZEXT416((uint)fVar22),0x10);
          auVar40 = ZEXT1664(CONCAT88(0x8000000000000000,0x8000000000000000));
          auVar39 = ZEXT1664(CONCAT88(0x3fdfffffffffffff,0x3fdfffffffffffff));
          iVar13 = iVar13 + 1;
          auVar32._0_4_ = auVar19._0_4_ * fVar21;
          auVar32._4_4_ = auVar19._4_4_ * fVar21;
          auVar32._8_4_ = auVar19._8_4_ * fVar21;
          auVar32._12_4_ = auVar19._12_4_ * fVar21;
          auVar6._8_4_ = 0x7fffffff;
          auVar6._0_8_ = 0x7fffffff7fffffff;
          auVar6._12_4_ = 0x7fffffff;
          auVar19 = vandps_avx512vl(auVar32,auVar6);
          auVar19 = vmovlhps_avx(auVar32,auVar19);
          local_d8 = local_d8 + auVar19._0_4_;
          fStack_d4 = fStack_d4 + auVar19._4_4_;
          fStack_d0 = fStack_d0 + auVar19._8_4_;
          fStack_cc = fStack_cc + auVar19._12_4_;
        } while (iVar13 != -3);
        iVar10 = iVar10 + 1;
      } while (iVar10 != local_f8);
      local_fc = local_fc + 1.0;
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)((local_fc + -2.0) * (local_fc + -2.0))),
                                ZEXT416((uint)(fVar45 + -2.0)),ZEXT416((uint)(fVar45 + -2.0)));
      fVar21 = expf(auVar17._0_4_ / -4.5);
      auVar40 = ZEXT1664(CONCAT88(0x8000000000000000,0x8000000000000000));
      iVar12 = iVar12 + 5;
      auVar38._0_4_ = (float)((double)fVar21 * 0.0707355302630646);
      auVar38._4_4_ = (int)((ulong)((double)fVar21 * 0.0707355302630646) >> 0x20);
      auVar38._8_8_ = 0;
      auVar7._4_4_ = fStack_d4;
      auVar7._0_4_ = local_d8;
      auVar7._8_4_ = fStack_d0;
      auVar7._12_4_ = fStack_cc;
      auVar18 = vshufpd_avx(auVar7,auVar7,1);
      pfVar1 = ipoint->descriptor + lVar11;
      *pfVar1 = local_d8 * auVar38._0_4_;
      pfVar1[1] = fStack_d4 * auVar38._0_4_;
      pfVar1[2] = fStack_d0 * auVar38._0_4_;
      pfVar1[3] = fStack_cc * auVar38._0_4_;
      auVar36._0_4_ = local_d8 * local_d8;
      auVar36._4_4_ = fStack_d4 * fStack_d4;
      auVar36._8_4_ = fStack_d0 * fStack_d0;
      auVar36._12_4_ = fStack_cc * fStack_cc;
      lVar11 = lVar11 + 4;
      auVar17 = vmovshdup_avx(auVar36);
      auVar17 = vfmadd231ss_fma(auVar17,auVar7,auVar7);
      auVar18 = vfmadd213ss_fma(auVar18,auVar18,auVar17);
      auVar17 = vshufps_avx(auVar7,auVar7,0xff);
      auVar17 = vfmadd213ss_fma(auVar17,auVar17,auVar18);
      auVar17 = vfmadd231ss_fma(ZEXT416(auVar33._0_4_),auVar38,
                                ZEXT416((uint)(auVar17._0_4_ * auVar38._0_4_)));
      auVar33 = ZEXT1664(auVar17);
      auVar39 = ZEXT1664(CONCAT88(0x3fdfffffffffffff,0x3fdfffffffffffff));
      bVar3 = iVar9 < 7;
      iVar9 = iVar9 + 5;
    } while (bVar3);
    local_f8 = local_f8 + 5;
    bVar3 = iVar8 < 7;
    iVar8 = iVar8 + 5;
  } while (bVar3);
  if (auVar17._0_4_ < 0.0) {
    fVar21 = sqrtf(auVar17._0_4_);
  }
  else {
    auVar14 = vsqrtss_avx(auVar17,auVar17);
    fVar21 = auVar14._0_4_;
  }
  lVar11 = 0;
  auVar33 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar21)));
  do {
    auVar39 = vmulps_avx512f(auVar33,*(undefined1 (*) [64])(ipoint->descriptor + lVar11));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar11) = auVar39;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int ipoint_x = (int) round(ipoint->x);
    int ipoint_y = (int) round(ipoint->y);

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -0.5f;
    float cy = 0.0f;

    //float co = 1;
    //float si = 0;

    int i = -8;

    // calculate descriptor for this interest point
    while(i < 12) {

        int j = -8;
        i = i - 4;

        cx += 1.0f; // 4 x Add
        cy = -0.5f;

        while(j < 12) {
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            cy += 1.0f; // 16 x Add

            j = j - 4;

            //int xs = (int) round(ipoint_x + ( -jx*scale*si + ix*scale*co));
            //int ys = (int) round(ipoint_y + ( jx*scale*co + ix*scale*si));
            // TODO: (Sebastian) I think this should be i + 4 and j + 4 (OpenSURF also wrong)
            //int xs = (int) round(ipoint_x + (i + 5) * scale);
            //int ys = (int) round(ipoint_y + (j + 5) * scale);
            int xs = (int) round(ipoint_x + (i + 4.5) * scale); // 16 x Add + 16 x Mul + 16 x round + 16 x float->int
            int ys = (int) round(ipoint_y + (j + 4.5) * scale); // 16 x Add + 16 x Mul + 16 x round + 16 x float->int

            for (int k = i; k < i + 9; ++k) {
                for (int l = j; l < j + 9; ++l) {

                    //Get coords of sample point on the rotated axis
                    //int sample_x = (int) round(ipoint_x + (-l*scale*si + k*scale*co));
                    //int sample_y = (int) round(ipoint_y + ( l*scale*co + k*scale*si));
                    int sample_x = (int) round(ipoint_x + (k+0.5) * scale); // 81*32 x Add + 81*16 x Mul + 81*16 x round + 81*16 x float->int
                    int sample_y = (int) round(ipoint_y + (l+0.5) * scale); // 81*32 x Add + 81*16 x Mul + 81*16 x round + 81*16 x float->int

                    float gauss_s1 = gaussian((float) xs-sample_x, (float) ys-sample_y, 2.5f * scale); // 81*32 x int->float + 81*16 x Mul + 81*16 x gaussian(2 div + 8 x mul + 1 x add + 1 x exp) => Total: 81*32 x int->float + 81*16*9 Mul + 81*16*2 Div + 81*16 Add + 81*16 Exp
                                        
                    float rx = haarX(iimage, sample_y, sample_x, (int) 2.0 * round(scale)); // 81*16 mul + 81*16 round + 81*16 x float->int + 81*16 x haarX(7 x add + 2 x fmax) => Total: 81*16 mul + 81*16 round + 81*16 x float->int + 81*16*7 x add + 81*16*2 x fmax
                    float ry = haarY(iimage, sample_y, sample_x, (int) 2.0 * round(scale)); // 81*16 mul + 81*16 round + 81*16 x float->int + 81*16 x haarY(7 x add + 2 x fmax) => Total: 81*16 mul + 81*16 round + 81*16 x float->int + 81*16*7 x add + 81*16*2 x fmax
                    // printf("sample_x,y:%i %i int_scale:%i rx:%f ry:%f\n",sample_x,sample_y,(int)round(scale),rx,ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    //float rrx = gauss_s1*(-rx*si + ry*co);
                    //float rry = gauss_s1*(rx*co + ry*si);
                    // TODO: (Sebastian) This seems weird...
                    float rrx = gauss_s1 * (ry); // 81*16 x Mul
                    float rry = gauss_s1 * (rx); // 81*16 x Mul

                    dx += rrx; // 81*16 x add
                    dy += rry; // 81*16 x add
                    mdx += (float) fabs(rrx); // 81*16 x add + 81*16 x fabs
                    mdy += (float) fabs(rry); // 81*16 x add + 81*16 x fabs

                }      
            }

            // TODO: (Sebastian) Precompute this...
            float gauss_s2 = gaussian(cx-2.0f, cy-2.0f, 1.5f); // 32 x add + 16 x gaussian(2 div + 8 x mul + 1 x add + 1 x exp) => Total: 48 add + 16*8 mul + 32 div + 16 exp

            // add the values to the descriptor vector
            descriptor[desc_idx] = dx * gauss_s2; // 16 x mul
            descriptor[desc_idx+1] = dy * gauss_s2; // 16 x mul
            descriptor[desc_idx+2] = mdx * gauss_s2; // 16 x mul
            descriptor[desc_idx+3] = mdy * gauss_s2; // 16 x mul

            // precompute for normaliztion
            sum_of_squares += (dx*dx + dy*dy + mdx*mdx + mdy*mdy) * gauss_s2*gauss_s2; // 6*16 x mul + 3*16 x add

            desc_idx += 4;

            j += 9;

        }

        i += 9;

    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrt(sum_of_squares); // 1 x div + 1 x sqrt

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor; // 64 x mul
    }

}